

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  InternalMetadata *this;
  InternalMetadata *this_00;
  int iVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  Reflection *this_01;
  Message *message2;
  LogFinisher local_61;
  LogMessage local_60;
  Message *message1;
  
  this = &(lhs->super_MessageLite)._internal_metadata_;
  pAVar2 = InternalMetadata::owning_arena(this);
  this_00 = &(rhs->super_MessageLite)._internal_metadata_;
  pAVar3 = InternalMetadata::owning_arena(this_00);
  if (pAVar2 == pAVar3) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1a8);
    pLVar4 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != Arena::InternalHelper<Message>::GetOwningArena(rhs): "
                       );
    LogFinisher::operator=(&local_61,pLVar4);
    LogMessage::~LogMessage(&local_60);
  }
  pAVar2 = InternalMetadata::owning_arena(this);
  if ((pAVar2 == (Arena *)0x0) &&
     (pAVar2 = InternalMetadata::owning_arena(this_00), pAVar2 == (Arena *)0x0)) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1aa);
    pLVar4 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr || Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr: "
                       );
    LogFinisher::operator=(&local_61,pLVar4);
    LogMessage::~LogMessage(&local_60);
  }
  pAVar2 = InternalMetadata::owning_arena(this_00);
  message2 = rhs;
  if (pAVar2 == (Arena *)0x0) {
    pAVar2 = InternalMetadata::owning_arena(this);
    message2 = lhs;
    lhs = rhs;
  }
  iVar1 = (*(message2->super_MessageLite)._vptr_MessageLite[3])(message2,pAVar2);
  message1 = (Message *)CONCAT44(extraout_var,iVar1);
  (*(message1->super_MessageLite)._vptr_MessageLite[7])(message1,lhs);
  (*(lhs->super_MessageLite)._vptr_MessageLite[4])(lhs);
  (*(lhs->super_MessageLite)._vptr_MessageLite[7])(lhs,message2);
  (*(message2->super_MessageLite)._vptr_MessageLite[0x11])(message2);
  Reflection::Swap(this_01,message1,message2);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
#ifndef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) !=
         Arena::InternalHelper<Message>::GetOwningArena(rhs));
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr ||
         Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->Clear();
  rhs->CheckTypeAndMergeFrom(*tmp);
  if (arena == nullptr) delete tmp;
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->GetReflection()->Swap(tmp, rhs);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
}